

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_local_time_only<toml::type_config>
            (result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar1;
  uint uVar2;
  value_type vVar3;
  value_type vVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  value_type *pvVar11;
  _Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region> *p_Var12;
  _Alloc_hider _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  uint *puVar15;
  value_type *pvVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  undefined1 uVar20;
  undefined8 uVar21;
  undefined1 uVar22;
  region *this;
  _Alloc_hider _Var23;
  undefined1 uVar24;
  source_location src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> secfrac;
  string str;
  result<int,_toml::detail::none_t> ns_r;
  result<int,_toml::detail::none_t> us_r;
  result<int,_toml::detail::none_t> ms_r;
  result<int,_toml::detail::none_t> sec_r;
  result<int,_toml::detail::none_t> minute_r;
  result<int,_toml::detail::none_t> hour_r;
  region reg;
  location first;
  undefined1 local_eb8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e98;
  undefined8 local_e88;
  _Alloc_hider _Stack_e80;
  _Alloc_hider local_e78;
  undefined1 auStack_e70 [24];
  pointer local_e58;
  undefined8 uStack_e50;
  pointer local_e48;
  undefined1 local_e40;
  undefined1 local_e3f;
  undefined1 local_e3e;
  undefined4 local_e3c;
  undefined2 local_e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  undefined1 local_df0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dd0;
  _Alloc_hider local_db8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_da8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  string local_d68;
  result<int,_toml::detail::none_t> local_d48;
  result<int,_toml::detail::none_t> local_d40;
  result<int,_toml::detail::none_t> local_d38;
  result<int,_toml::detail::none_t> local_d30;
  result<int,_toml::detail::none_t> local_d28;
  result<int,_toml::detail::none_t> local_d20;
  region local_d18;
  undefined4 local_caf;
  undefined3 uStack_cab;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  pointer local_be8;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  location local_a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_9d0;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  _Alloc_hider local_998;
  size_type local_990;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_988;
  pointer local_978;
  pointer pbStack_970;
  pointer local_968;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_958;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_950;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 local_928;
  undefined4 uStack_924;
  undefined4 uStack_920;
  undefined4 uStack_91c;
  _Alloc_hider local_918;
  size_type local_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  pointer local_8f8;
  pointer pbStack_8f0;
  pointer local_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8d0;
  undefined4 local_8c8;
  undefined4 uStack_8c4;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 local_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  _Alloc_hider local_898;
  size_type local_890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_888;
  pointer local_878;
  pointer pbStack_870;
  pointer local_868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_850;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  _Alloc_hider local_818;
  size_type local_810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  pointer local_7f8;
  pointer pbStack_7f0;
  pointer local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7d0;
  undefined4 local_7c8;
  undefined4 uStack_7c4;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_7a8;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  _Alloc_hider local_798;
  size_type local_790;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_788;
  pointer local_778;
  pointer pbStack_770;
  pointer local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_758;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_750;
  undefined4 local_748;
  undefined4 uStack_744;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  _Alloc_hider local_718;
  size_type local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  pointer local_6f8;
  pointer pbStack_6f0;
  pointer local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6d0;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  _Alloc_hider local_698;
  size_type local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  pointer local_678;
  pointer pbStack_670;
  pointer local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_650;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 local_628;
  undefined4 uStack_624;
  undefined4 uStack_620;
  undefined4 uStack_61c;
  _Alloc_hider local_618;
  size_type local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  pointer local_5f8;
  pointer pbStack_5f0;
  pointer local_5e8;
  location local_5d8;
  location local_590;
  success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
  local_548;
  success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
  local_4b8;
  success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
  local_428;
  failure<toml::error_info> local_3a0;
  failure<toml::error_info> local_348;
  failure<toml::error_info> local_2f0;
  failure<toml::error_info> local_298;
  failure<toml::error_info> local_240;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  location::location(&local_a20,loc);
  syntax::local_time((sequence *)local_eb8,&ctx->toml_spec_);
  sequence::scan(&local_d18,(sequence *)local_eb8,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_eb8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if ((ctx->toml_spec_).v1_1_0_make_seconds_optional == true) {
      local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a40,
                 "toml::parse_local_time: invalid time: time must be HH:MM(:SS.sss) (seconds are optional)"
                 ,"");
      syntax::local_time((sequence *)local_df0,&ctx->toml_spec_);
      location::location(&local_590,loc);
      local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"");
      make_syntax_error<toml::detail::sequence>
                ((error_info *)local_eb8,&local_a40,(sequence *)local_df0,&local_590,&local_a60);
      err<toml::error_info>(&local_88,(error_info *)local_eb8);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
      failure<toml::error_info>::~failure(&local_88);
      if (_Stack_e80._M_p != auStack_e70) {
        operator_delete(_Stack_e80._M_p,auStack_e70._0_8_ + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_e98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_eb8._0_8_ != &local_ea8) {
        operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
        operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_590);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_df0 + 8));
      local_a80.field_2._M_allocated_capacity = local_a40.field_2._M_allocated_capacity;
      local_d68._M_dataplus._M_p = local_a40._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a40._M_dataplus._M_p == &local_a40.field_2) goto LAB_003c3155;
    }
    else {
      local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a80,
                 "toml::parse_local_time: invalid time: time must be HH:MM:SS(.sss) (subseconds are optional)"
                 ,"");
      syntax::local_time((sequence *)local_df0,&ctx->toml_spec_);
      location::location(&local_5d8,loc);
      local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"");
      make_syntax_error<toml::detail::sequence>
                ((error_info *)local_eb8,&local_a80,(sequence *)local_df0,&local_5d8,&local_aa0);
      err<toml::error_info>(&local_e0,(error_info *)local_eb8);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
      failure<toml::error_info>::~failure(&local_e0);
      if (_Stack_e80._M_p != auStack_e70) {
        operator_delete(_Stack_e80._M_p,auStack_e70._0_8_ + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_e98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_eb8._0_8_ != &local_ea8) {
        operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
        operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_5d8);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_df0 + 8));
      local_d68._M_dataplus._M_p = local_a80._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a80._M_dataplus._M_p == &local_a80.field_2) goto LAB_003c3155;
    }
  }
  else {
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_d68,
               (detail *)
               (local_d18.first_ +
               *(size_type *)
                local_d18.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr),
               (uchar *)(*(size_type *)
                          local_d18.source_.
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + local_d18.last_),in_RCX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,0,2);
    from_string<int>((detail *)&local_d20,(string *)local_eb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb8._0_8_ != &local_ea8) {
      operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,3,2);
    from_string<int>((detail *)&local_d28,(string *)local_eb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb8._0_8_ != &local_ea8) {
      operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
    }
    if (local_d20.is_ok_ == false) {
      region::region((region *)local_df0,&local_a20);
      source_location::source_location((source_location *)local_eb8,(region *)local_df0);
      region::~region((region *)local_df0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_e30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,0,2
                );
      pbVar18 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::replace(&local_e30,0,0,"toml::parse_local_time: failed to read hour `",0x2d);
      local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar18->_M_dataplus)._M_p;
      paVar17 = &pbVar18->field_2;
      if (paVar19 == paVar17) {
        local_e10.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_e10.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
      }
      else {
        local_e10.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_e10._M_dataplus._M_p = (pointer)paVar19;
      }
      local_e10._M_string_length = pbVar18->_M_string_length;
      (pbVar18->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar18->_M_string_length = 0;
      (pbVar18->field_2)._M_local_buf[0] = '\0';
      pbVar18 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append(&local_e10,"`");
      local_c08._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
      paVar19 = &pbVar18->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c08._M_dataplus._M_p == paVar19) {
        local_c08.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_c08.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
        local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
      }
      else {
        local_c08.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
      }
      local_c08._M_string_length = pbVar18->_M_string_length;
      (pbVar18->_M_dataplus)._M_p = (pointer)paVar19;
      pbVar18->_M_string_length = 0;
      (pbVar18->field_2)._M_local_buf[0] = '\0';
      local_618._M_p = (pointer)&local_608;
      local_628 = (undefined4)local_e88;
      uStack_624 = local_e88._4_4_;
      uStack_620 = _Stack_e80._M_p._0_4_;
      uStack_61c = _Stack_e80._M_p._4_4_;
      local_638 = local_e98._M_allocated_capacity._0_4_;
      uStack_634 = local_e98._M_allocated_capacity._4_4_;
      uStack_630 = local_e98._8_4_;
      uStack_62c = local_e98._12_4_;
      local_648 = local_ea8._M_allocated_capacity._0_4_;
      uStack_644 = local_ea8._M_allocated_capacity._4_4_;
      uStack_640 = local_ea8._8_4_;
      uStack_63c = local_ea8._12_4_;
      local_658 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_eb8._0_8_;
      p_Stack_650 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e78._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(auStack_e70 + 8)) {
        local_608._8_8_ = auStack_e70._16_8_;
      }
      else {
        local_618._M_p = local_e78._M_p;
      }
      local_610 = auStack_e70._0_8_;
      auStack_e70._0_8_ = 0;
      auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
      local_5f8 = local_e58;
      pbStack_5f0 = uStack_e50;
      local_5e8 = local_e48;
      local_e58 = (pointer)0x0;
      uStack_e50 = (pointer)0x0;
      local_e48 = (pointer)0x0;
      local_e78._M_p = (pointer)(auStack_e70 + 8);
      local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"here","");
      make_error_info<>((error_info *)local_df0,&local_c08,(source_location *)&local_658,&local_ac0)
      ;
      err<toml::error_info>(&local_138,(error_info *)local_df0);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_p != local_da8) {
        operator_delete(local_db8._M_p,local_da8[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_dd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df0._0_8_ != &local_de0) {
        operator_delete((void *)local_df0._0_8_,(ulong)(local_de0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
        operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)&local_658);
      uVar21 = local_c08.field_2._M_allocated_capacity;
      _Var23._M_p = local_c08._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
LAB_003c30e6:
        operator_delete(_Var23._M_p,uVar21 + 1);
      }
LAB_003c30ee:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
        operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
      }
      local_b00.field_2._M_allocated_capacity = local_e30.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
LAB_003c3124:
        operator_delete(local_e30._M_dataplus._M_p,local_b00.field_2._M_allocated_capacity + 1);
      }
LAB_003c312c:
      source_location::~source_location((source_location *)local_eb8);
    }
    else {
      if (local_d28.is_ok_ == false) {
        region::region((region *)local_df0,&local_a20);
        source_location::source_location((source_location *)local_eb8,(region *)local_df0);
        region::~region((region *)local_df0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_e30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,3
                   ,2);
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            (&local_e30,0,0,"toml::parse_local_time: failed to read minute `",0x2f);
        local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar18->_M_dataplus)._M_p;
        paVar17 = &pbVar18->field_2;
        if (paVar19 == paVar17) {
          local_e10.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_e10.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
        }
        else {
          local_e10.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_e10._M_dataplus._M_p = (pointer)paVar19;
        }
        local_e10._M_string_length = pbVar18->_M_string_length;
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        pbVar18 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                            (&local_e10,"`");
        local_c28._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
        paVar19 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c28._M_dataplus._M_p == paVar19) {
          local_c28.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_c28.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
        }
        else {
          local_c28.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
        }
        local_c28._M_string_length = pbVar18->_M_string_length;
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar19;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        local_698._M_p = (pointer)&local_688;
        local_6a8 = (undefined4)local_e88;
        uStack_6a4 = local_e88._4_4_;
        uStack_6a0 = _Stack_e80._M_p._0_4_;
        uStack_69c = _Stack_e80._M_p._4_4_;
        local_6b8 = local_e98._M_allocated_capacity._0_4_;
        uStack_6b4 = local_e98._M_allocated_capacity._4_4_;
        uStack_6b0 = local_e98._8_4_;
        uStack_6ac = local_e98._12_4_;
        local_6c8 = local_ea8._M_allocated_capacity._0_4_;
        uStack_6c4 = local_ea8._M_allocated_capacity._4_4_;
        uStack_6c0 = local_ea8._8_4_;
        uStack_6bc = local_ea8._12_4_;
        local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_eb8._0_8_;
        p_Stack_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e78._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_e70 + 8)) {
          local_688._8_8_ = auStack_e70._16_8_;
        }
        else {
          local_698._M_p = local_e78._M_p;
        }
        local_690 = auStack_e70._0_8_;
        auStack_e70._0_8_ = 0;
        auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
        local_678 = local_e58;
        pbStack_670 = uStack_e50;
        local_668 = local_e48;
        local_e58 = (pointer)0x0;
        uStack_e50 = (pointer)0x0;
        local_e48 = (pointer)0x0;
        local_e78._M_p = (pointer)(auStack_e70 + 8);
        local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae0,"here","");
        make_error_info<>((error_info *)local_df0,&local_c28,(source_location *)&local_6d8,
                          &local_ae0);
        err<toml::error_info>(&local_190,(error_info *)local_df0);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_190)
        ;
        failure<toml::error_info>::~failure(&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_db8._M_p != local_da8) {
          operator_delete(local_db8._M_p,local_da8[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_dd0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df0._0_8_ != &local_de0) {
          operator_delete((void *)local_df0._0_8_,(ulong)(local_de0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
          operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_6d8);
        uVar21 = local_c28.field_2._M_allocated_capacity;
        _Var23._M_p = local_c28._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c28._M_dataplus._M_p != &local_c28.field_2) goto LAB_003c30e6;
        goto LAB_003c30ee;
      }
      puVar15 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                  (&local_d20,(source_location)0x529268);
      uVar2 = *puVar15;
      puVar15 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                  (&local_d28,(source_location)0x529280);
      _Var13._M_p = local_d18.source_name_._M_dataplus._M_p;
      if (0x3b < *puVar15 || 0x17 < uVar2) {
        region::region((region *)local_df0,&local_a20);
        source_location::source_location((source_location *)local_eb8,(region *)local_df0);
        region::~region((region *)local_df0);
        local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b00,"toml::parse_local_time: invalid time.","");
        local_718._M_p = (pointer)&local_708;
        local_728 = (undefined4)local_e88;
        uStack_724 = local_e88._4_4_;
        uStack_720 = _Stack_e80._M_p._0_4_;
        uStack_71c = _Stack_e80._M_p._4_4_;
        local_738 = local_e98._M_allocated_capacity._0_4_;
        uStack_734 = local_e98._M_allocated_capacity._4_4_;
        uStack_730 = local_e98._8_4_;
        uStack_72c = local_e98._12_4_;
        local_748 = local_ea8._M_allocated_capacity._0_4_;
        uStack_744 = local_ea8._M_allocated_capacity._4_4_;
        uStack_740 = local_ea8._8_4_;
        uStack_73c = local_ea8._12_4_;
        local_758 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_eb8._0_8_;
        p_Stack_750 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e78._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_e70 + 8)) {
          local_708._8_8_ = auStack_e70._16_8_;
        }
        else {
          local_718._M_p = local_e78._M_p;
        }
        local_710 = auStack_e70._0_8_;
        auStack_e70._0_8_ = 0;
        auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
        local_6f8 = local_e58;
        pbStack_6f0 = uStack_e50;
        local_6e8 = local_e48;
        local_e58 = (pointer)0x0;
        uStack_e50 = (pointer)0x0;
        local_e48 = (pointer)0x0;
        local_e78._M_p = (pointer)(auStack_e70 + 8);
        local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b20,"hour must be 00-23, minute must be 00-59.","");
        make_error_info<>((error_info *)local_df0,&local_b00,(source_location *)&local_758,
                          &local_b20);
        err<toml::error_info>(&local_1e8,(error_info *)local_df0);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_1e8)
        ;
        failure<toml::error_info>::~failure(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_db8._M_p != local_da8) {
          operator_delete(local_db8._M_p,local_da8[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_dd0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df0._0_8_ != &local_de0) {
          operator_delete((void *)local_df0._0_8_,(ulong)(local_de0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
          operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_758);
        local_e30._M_dataplus._M_p = local_b00._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b00._M_dataplus._M_p != &local_b00.field_2) goto LAB_003c3124;
        goto LAB_003c312c;
      }
      uVar20 = (undefined1)uVar2;
      uVar24 = (undefined1)*puVar15;
      if ((local_d68._M_string_length == 5) &&
         ((ctx->toml_spec_).v1_1_0_make_seconds_optional == true)) {
        paVar19 = &local_d18.source_name_.field_2;
        local_ea8._M_allocated_capacity = (size_type)&local_e98;
        local_eb8._0_8_ =
             local_d18.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_eb8._8_8_ =
             local_d18.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_d18.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_d18.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18.source_name_._M_dataplus._M_p == paVar19) {
          local_e98._8_8_ = local_d18.source_name_.field_2._8_8_;
        }
        else {
          local_ea8._M_allocated_capacity = (size_type)local_d18.source_name_._M_dataplus._M_p;
        }
        local_ea8._8_8_ = local_d18.source_name_._M_string_length;
        local_d18.source_name_._M_string_length = 0;
        local_d18.source_name_.field_2._M_local_buf[0] = '\0';
        local_e88 = (pointer)local_d18.length_;
        _Stack_e80._M_p = (pointer)local_d18.first_;
        local_e78._M_p = (pointer)local_d18.first_line_;
        auStack_e70._0_8_ = local_d18.first_column_;
        auStack_e70._8_8_ = local_d18.last_;
        auStack_e70._16_8_ = local_d18.last_line_;
        local_e58 = (pointer)local_d18.last_column_;
        uStack_e50 = (pointer)((ulong)uStack_e50 & 0xffffffffffffff00);
        local_e48 = (pointer)0x0;
        local_e3e = 0;
        local_e3c = 0;
        local_e38 = 0;
        local_e40 = uVar20;
        local_e3f = uVar24;
        local_d18.source_name_._M_dataplus._M_p = (pointer)paVar19;
        ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                  (&local_428,(toml *)local_eb8,
                   (tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *)
                   _Var13._M_p);
        _Var14._M_pi = local_428.value.
                       super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                       .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                       super__Tuple_impl<2UL,_toml::detail::region>.
                       super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        __return_storage_ptr__->is_ok_ = true;
        local_428.value.
        super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
        .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
        super__Tuple_impl<2UL,_toml::detail::region>.
        super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)
         &(__return_storage_ptr__->field_1).succ_.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_ =
             local_428.value.
             super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
             .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
             super__Tuple_impl<2UL,_toml::detail::region>.
             super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&(__return_storage_ptr__->field_1).succ_.value.
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 8))->_M_pi =
             _Var14._M_pi;
        local_428.value.
        super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
        .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
        super__Tuple_impl<2UL,_toml::detail::region>.
        super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&(__return_storage_ptr__->field_1).succ_.value.
                             super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                             .
                             super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                             .super__Tuple_impl<2UL,_toml::detail::region>.
                             super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x20)
        ;
        (((string *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
        _M_dataplus)._M_p = (pointer)paVar19;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&local_428.value.
                             super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                             .
                             super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                             .super__Tuple_impl<2UL,_toml::detail::region>.
                             super__Head_base<2UL,_toml::detail::region,_false> + 0x20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
               _M_dataplus._M_p == paVar17) {
          paVar19->_M_allocated_capacity =
               local_428.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2.
               _M_allocated_capacity;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x28) =
               local_428.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2.
               _8_8_;
        }
        else {
          (((string *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
          _M_dataplus)._M_p =
               local_428.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
               _M_dataplus._M_p;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(__return_storage_ptr__->field_1).succ_.value.
                      super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                      .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                      super__Tuple_impl<2UL,_toml::detail::region>.
                      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x20))->
          _M_allocated_capacity =
               local_428.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2.
               _M_allocated_capacity;
        }
        this = (region *)&local_428;
LAB_003c3b80:
        *(size_type *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x18) =
             (this->source_name_)._M_string_length;
        (this->source_name_)._M_dataplus._M_p = (pointer)paVar17;
        (this->source_name_)._M_string_length = 0;
        (this->source_name_).field_2._M_local_buf[0] = '\0';
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x60) =
             this->last_column_;
        sVar5 = this->length_;
        sVar6 = this->first_;
        sVar7 = this->first_line_;
        sVar8 = this->first_column_;
        sVar9 = this->last_line_;
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x50) =
             this->last_;
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x58) = sVar9;
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x40) = sVar7;
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x48) = sVar8;
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x30) = sVar5;
        *(size_t *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x38) = sVar6;
        p_Var10 = this[1].source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        *(element_type **)
         &(__return_storage_ptr__->field_1).succ_.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl =
             this[1].source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        (__return_storage_ptr__->field_1).succ_.value.
        super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
        .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
        super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.subsecond_precision
             = (size_t)p_Var10;
        *(pointer *)
         &(__return_storage_ptr__->field_1).succ_.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl =
             this[1].source_name_._M_dataplus._M_p;
        *(short *)((long)&__return_storage_ptr__->field_1 + 0x80) =
             (short)this[1].source_name_._M_string_length;
        region::~region(this);
        region::~region((region *)local_eb8);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,6
                   ,2);
        from_string<int>((detail *)&local_d30,(string *)local_eb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_eb8._0_8_ != &local_ea8) {
          operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
        }
        if (local_d30.is_ok_ == false) {
          region::region((region *)local_df0,&local_a20);
          source_location::source_location((source_location *)local_eb8,(region *)local_df0);
          region::~region((region *)local_df0);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_e30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,6,2
                );
          pbVar18 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                              (&local_e30,0,0,"toml::parse_local_time: failed to read second `",0x2f
                              );
          local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar18->_M_dataplus)._M_p;
          paVar17 = &pbVar18->field_2;
          if (paVar19 == paVar17) {
            local_e10.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_e10.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            local_e10.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_e10._M_dataplus._M_p = (pointer)paVar19;
          }
          local_e10._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                              (&local_e10,"`");
          local_c48._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
          paVar19 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c48._M_dataplus._M_p == paVar19) {
            local_c48.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_c48.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
          }
          else {
            local_c48.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          }
          local_c48._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          local_798._M_p = (pointer)&local_788;
          local_7a8 = (undefined4)local_e88;
          uStack_7a4 = local_e88._4_4_;
          uStack_7a0 = _Stack_e80._M_p._0_4_;
          uStack_79c = _Stack_e80._M_p._4_4_;
          local_7b8 = local_e98._M_allocated_capacity._0_4_;
          uStack_7b4 = local_e98._M_allocated_capacity._4_4_;
          uStack_7b0 = local_e98._8_4_;
          uStack_7ac = local_e98._12_4_;
          local_7c8 = local_ea8._M_allocated_capacity._0_4_;
          uStack_7c4 = local_ea8._M_allocated_capacity._4_4_;
          uStack_7c0 = local_ea8._8_4_;
          uStack_7bc = local_ea8._12_4_;
          local_7d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_eb8._0_8_;
          p_Stack_7d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e78._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(auStack_e70 + 8)) {
            local_788._8_8_ = auStack_e70._16_8_;
          }
          else {
            local_798._M_p = local_e78._M_p;
          }
          local_790 = auStack_e70._0_8_;
          auStack_e70._0_8_ = 0;
          auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
          local_778 = local_e58;
          pbStack_770 = uStack_e50;
          local_768 = local_e48;
          local_e58 = (pointer)0x0;
          uStack_e50 = (pointer)0x0;
          local_e48 = (pointer)0x0;
          local_e78._M_p = (pointer)(auStack_e70 + 8);
          local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"here","");
          make_error_info<>((error_info *)local_df0,&local_c48,(source_location *)&local_7d8,
                            &local_b40);
          err<toml::error_info>(&local_240,(error_info *)local_df0);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_240);
          failure<toml::error_info>::~failure(&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_db8._M_p != local_da8) {
            operator_delete(local_db8._M_p,local_da8[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_dd0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_df0._0_8_ != &local_de0) {
            operator_delete((void *)local_df0._0_8_,(ulong)(local_de0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
            operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)&local_7d8);
          uVar21 = local_c48.field_2._M_allocated_capacity;
          _Var23._M_p = local_c48._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c48._M_dataplus._M_p != &local_c48.field_2) goto LAB_003c30e6;
          goto LAB_003c30ee;
        }
        puVar15 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                    (&local_d30,(source_location)0x529298);
        _Var13._M_p = local_d18.source_name_._M_dataplus._M_p;
        if (0x3c < *puVar15) {
          region::region((region *)local_df0,&local_a20);
          source_location::source_location((source_location *)local_eb8,(region *)local_df0);
          region::~region((region *)local_df0);
          local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b60,"toml::parse_local_time: invalid time.","");
          local_818._M_p = (pointer)&local_808;
          local_828 = (undefined4)local_e88;
          uStack_824 = local_e88._4_4_;
          uStack_820 = _Stack_e80._M_p._0_4_;
          uStack_81c = _Stack_e80._M_p._4_4_;
          local_838 = local_e98._M_allocated_capacity._0_4_;
          uStack_834 = local_e98._M_allocated_capacity._4_4_;
          uStack_830 = local_e98._8_4_;
          uStack_82c = local_e98._12_4_;
          local_848 = local_ea8._M_allocated_capacity._0_4_;
          uStack_844 = local_ea8._M_allocated_capacity._4_4_;
          uStack_840 = local_ea8._8_4_;
          uStack_83c = local_ea8._12_4_;
          local_858 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_eb8._0_8_;
          p_Stack_850 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e78._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(auStack_e70 + 8)) {
            local_808._8_8_ = auStack_e70._16_8_;
          }
          else {
            local_818._M_p = local_e78._M_p;
          }
          local_810 = auStack_e70._0_8_;
          auStack_e70._0_8_ = 0;
          auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
          local_7f8 = local_e58;
          pbStack_7f0 = uStack_e50;
          local_7e8 = local_e48;
          local_e58 = (pointer)0x0;
          uStack_e50 = (pointer)0x0;
          local_e48 = (pointer)0x0;
          local_e78._M_p = (pointer)(auStack_e70 + 8);
          local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b80,"second must be 00-60.","");
          make_error_info<>((error_info *)local_df0,&local_b60,(source_location *)&local_858,
                            &local_b80);
          err<toml::error_info>(&local_298,(error_info *)local_df0);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_298);
          failure<toml::error_info>::~failure(&local_298);
          error_info::~error_info((error_info *)local_df0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
            operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)&local_858);
          local_b00.field_2._M_allocated_capacity = local_b60.field_2._M_allocated_capacity;
          local_e30._M_dataplus._M_p = local_b60._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b60._M_dataplus._M_p != &local_b60.field_2) goto LAB_003c3124;
          goto LAB_003c312c;
        }
        uVar22 = (undefined1)*puVar15;
        if (local_d68._M_string_length == 8) {
          paVar19 = &local_d18.source_name_.field_2;
          local_ea8._M_allocated_capacity = (size_type)&local_e98;
          local_eb8._0_8_ =
               local_d18.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_eb8._8_8_ =
               local_d18.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_d18.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_d18.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d18.source_name_._M_dataplus._M_p == paVar19) {
            local_e98._8_8_ = local_d18.source_name_.field_2._8_8_;
          }
          else {
            local_ea8._M_allocated_capacity = (size_type)local_d18.source_name_._M_dataplus._M_p;
          }
          local_ea8._8_8_ = local_d18.source_name_._M_string_length;
          local_d18.source_name_._M_string_length = 0;
          local_d18.source_name_.field_2._M_local_buf[0] = '\0';
          local_e88 = (pointer)local_d18.length_;
          _Stack_e80._M_p = (pointer)local_d18.first_;
          local_e78._M_p = (pointer)local_d18.first_line_;
          auStack_e70._0_8_ = local_d18.first_column_;
          auStack_e70._8_8_ = local_d18.last_;
          auStack_e70._16_8_ = local_d18.last_line_;
          local_e58 = (pointer)local_d18.last_column_;
          uStack_e50 = (pointer)CONCAT71(uStack_e50._1_7_,1);
          local_e48 = (pointer)0x0;
          local_e3c = 0;
          local_e38 = 0;
          local_e40 = uVar20;
          local_e3f = uVar24;
          local_e3e = uVar22;
          local_d18.source_name_._M_dataplus._M_p = (pointer)paVar19;
          ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                    (&local_4b8,(toml *)local_eb8,
                     (tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *)
                     _Var13._M_p);
          _Var14._M_pi = local_4b8.value.
                         super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                         .super__Tuple_impl<2UL,_toml::detail::region>.
                         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          __return_storage_ptr__->is_ok_ = true;
          local_4b8.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(element_type **)
           &(__return_storage_ptr__->field_1).succ_.value.
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Tuple_impl<2UL,_toml::detail::region>.
            super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_ =
               local_4b8.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&(__return_storage_ptr__->field_1).succ_.value.
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                  super__Tuple_impl<2UL,_toml::detail::region>.
                  super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 8))->_M_pi =
               _Var14._M_pi;
          local_4b8.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&(__return_storage_ptr__->field_1).succ_.value.
                               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl +
                       0x20);
          (((string *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
          _M_dataplus)._M_p = (pointer)paVar19;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_4b8.value.
                               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false> + 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 _M_dataplus._M_p == paVar17) {
            paVar19->_M_allocated_capacity =
                 local_4b8.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 field_2._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->field_1).succ_.value.
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                     super__Tuple_impl<2UL,_toml::detail::region>.
                     super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x28) =
                 local_4b8.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 field_2._8_8_;
          }
          else {
            (((string *)
             ((long)&(__return_storage_ptr__->field_1).succ_.value.
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                     super__Tuple_impl<2UL,_toml::detail::region>.
                     super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
            _M_dataplus)._M_p =
                 local_4b8.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 _M_dataplus._M_p;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)&(__return_storage_ptr__->field_1).succ_.value.
                        super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                        .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                        super__Tuple_impl<2UL,_toml::detail::region>.
                        super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x20))->
            _M_allocated_capacity =
                 local_4b8.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 field_2._M_allocated_capacity;
          }
          this = (region *)&local_4b8;
          goto LAB_003c3b80;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_e10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,9
                   ,local_d68._M_string_length - 9);
        local_be8 = (pointer)local_e10._M_string_length;
        if (local_e10._M_string_length < (pointer)0x9) {
          do {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_e10,'0');
          } while (local_e10._M_string_length < (pointer)0x9);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8,
                   &local_e10,0,3);
        from_string<int>((detail *)&local_d38,(string *)local_eb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_eb8._0_8_ != &local_ea8) {
          operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8,
                   &local_e10,3,3);
        from_string<int>((detail *)&local_d40,(string *)local_eb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_eb8._0_8_ != &local_ea8) {
          operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_eb8,
                   &local_e10,6,3);
        from_string<int>((detail *)&local_d48,(string *)local_eb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_eb8._0_8_ != &local_ea8) {
          operator_delete((void *)local_eb8._0_8_,local_ea8._M_allocated_capacity + 1);
        }
        if (local_d38.is_ok_ == false) {
          region::region((region *)local_df0,&local_a20);
          source_location::source_location((source_location *)local_eb8,(region *)local_df0);
          region::~region((region *)local_df0);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_d88,&local_e10,0,3);
          std::operator+(&local_e30,"toml::parse_local_time: failed to read milliseconds `",
                         &local_d88);
          pbVar18 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                              (&local_e30,"`");
          local_c68._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
          paVar19 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c68._M_dataplus._M_p == paVar19) {
            local_c68.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_c68.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
          }
          else {
            local_c68.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          }
          local_c68._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          local_898._M_p = (pointer)&local_888;
          local_8a8 = (undefined4)local_e88;
          uStack_8a4 = local_e88._4_4_;
          uStack_8a0 = _Stack_e80._M_p._0_4_;
          uStack_89c = _Stack_e80._M_p._4_4_;
          local_8b8 = local_e98._M_allocated_capacity._0_4_;
          uStack_8b4 = local_e98._M_allocated_capacity._4_4_;
          uStack_8b0 = local_e98._8_4_;
          uStack_8ac = local_e98._12_4_;
          local_8c8 = local_ea8._M_allocated_capacity._0_4_;
          uStack_8c4 = local_ea8._M_allocated_capacity._4_4_;
          uStack_8c0 = local_ea8._8_4_;
          uStack_8bc = local_ea8._12_4_;
          local_8d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_eb8._0_8_;
          p_Stack_8d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e78._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(auStack_e70 + 8)) {
            local_888._8_8_ = auStack_e70._16_8_;
          }
          else {
            local_898._M_p = local_e78._M_p;
          }
          local_890 = auStack_e70._0_8_;
          auStack_e70._0_8_ = 0;
          auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
          local_878 = local_e58;
          pbStack_870 = uStack_e50;
          local_868 = local_e48;
          local_e58 = (pointer)0x0;
          uStack_e50 = (pointer)0x0;
          local_e48 = (pointer)0x0;
          local_e78._M_p = (pointer)(auStack_e70 + 8);
          local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"here","");
          make_error_info<>((error_info *)local_df0,&local_c68,(source_location *)&local_8d8,
                            &local_ba0);
          err<toml::error_info>(&local_2f0,(error_info *)local_df0);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                     &local_2f0);
          failure<toml::error_info>::~failure(&local_2f0);
          error_info::~error_info((error_info *)local_df0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
            operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)&local_8d8);
          uVar21 = local_c68.field_2._M_allocated_capacity;
          _Var23._M_p = local_c68._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
LAB_003c4365:
            operator_delete(_Var23._M_p,uVar21 + 1);
          }
LAB_003c436d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
            operator_delete(local_e30._M_dataplus._M_p,local_e30.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
            operator_delete(local_d88._M_dataplus._M_p,local_d88.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_eb8);
        }
        else {
          if (local_d40.is_ok_ == false) {
            region::region((region *)local_df0,&local_a20);
            source_location::source_location((source_location *)local_eb8,(region *)local_df0);
            region::~region((region *)local_df0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_d88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,3
                   ,3);
            std::operator+(&local_e30,"toml::parse_local_time: failed to read microseconds`",
                           &local_d88);
            pbVar18 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_e30,"`");
            local_c88._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
            paVar19 = &pbVar18->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c88._M_dataplus._M_p == paVar19) {
              local_c88.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
              local_c88.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
              local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
            }
            else {
              local_c88.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
            }
            local_c88._M_string_length = pbVar18->_M_string_length;
            (pbVar18->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar18->_M_string_length = 0;
            (pbVar18->field_2)._M_local_buf[0] = '\0';
            local_918._M_p = (pointer)&local_908;
            local_928 = (undefined4)local_e88;
            uStack_924 = local_e88._4_4_;
            uStack_920 = _Stack_e80._M_p._0_4_;
            uStack_91c = _Stack_e80._M_p._4_4_;
            local_938 = local_e98._M_allocated_capacity._0_4_;
            uStack_934 = local_e98._M_allocated_capacity._4_4_;
            uStack_930 = local_e98._8_4_;
            uStack_92c = local_e98._12_4_;
            local_948 = local_ea8._M_allocated_capacity._0_4_;
            uStack_944 = local_ea8._M_allocated_capacity._4_4_;
            uStack_940 = local_ea8._8_4_;
            uStack_93c = local_ea8._12_4_;
            local_958 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_eb8._0_8_;
            p_Stack_950 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e78._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(auStack_e70 + 8)) {
              local_908._8_8_ = auStack_e70._16_8_;
            }
            else {
              local_918._M_p = local_e78._M_p;
            }
            local_910 = auStack_e70._0_8_;
            auStack_e70._0_8_ = 0;
            auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
            local_8f8 = local_e58;
            pbStack_8f0 = uStack_e50;
            local_8e8 = local_e48;
            local_e58 = (pointer)0x0;
            uStack_e50 = (pointer)0x0;
            local_e48 = (pointer)0x0;
            local_e78._M_p = (pointer)(auStack_e70 + 8);
            local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,"here","");
            make_error_info<>((error_info *)local_df0,&local_c88,(source_location *)&local_958,
                              &local_bc0);
            err<toml::error_info>(&local_348,(error_info *)local_df0);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_348);
            failure<toml::error_info>::~failure(&local_348);
            error_info::~error_info((error_info *)local_df0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
              operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)&local_958);
            uVar21 = local_c88.field_2._M_allocated_capacity;
            _Var23._M_p = local_c88._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c88._M_dataplus._M_p != &local_c88.field_2) goto LAB_003c4365;
            goto LAB_003c436d;
          }
          if (local_d48.is_ok_ == false) {
            region::region((region *)local_df0,&local_a20);
            source_location::source_location((source_location *)local_eb8,(region *)local_df0);
            region::~region((region *)local_df0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_d88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d68,6
                   ,3);
            std::operator+(&local_e30,"toml::parse_local_time: failed to read nanoseconds`",
                           &local_d88);
            pbVar18 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_e30,"`");
            local_ca8._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
            paVar19 = &pbVar18->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_dataplus._M_p == paVar19) {
              local_ca8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
              local_ca8.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
              local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
            }
            else {
              local_ca8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
            }
            local_ca8._M_string_length = pbVar18->_M_string_length;
            (pbVar18->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar18->_M_string_length = 0;
            (pbVar18->field_2)._M_local_buf[0] = '\0';
            local_998._M_p = (pointer)&local_988;
            local_9a8 = (undefined4)local_e88;
            uStack_9a4 = local_e88._4_4_;
            uStack_9a0 = _Stack_e80._M_p._0_4_;
            uStack_99c = _Stack_e80._M_p._4_4_;
            local_9b8 = local_e98._M_allocated_capacity._0_4_;
            uStack_9b4 = local_e98._M_allocated_capacity._4_4_;
            uStack_9b0 = local_e98._8_4_;
            uStack_9ac = local_e98._12_4_;
            local_9c8 = local_ea8._M_allocated_capacity._0_4_;
            uStack_9c4 = local_ea8._M_allocated_capacity._4_4_;
            uStack_9c0 = local_ea8._8_4_;
            uStack_9bc = local_ea8._12_4_;
            local_9d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_eb8._0_8_;
            p_Stack_9d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e78._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(auStack_e70 + 8)) {
              local_988._8_8_ = auStack_e70._16_8_;
            }
            else {
              local_998._M_p = local_e78._M_p;
            }
            local_990 = auStack_e70._0_8_;
            auStack_e70._0_8_ = 0;
            auStack_e70._8_8_ = auStack_e70._8_8_ & 0xffffffffffffff00;
            local_978 = local_e58;
            pbStack_970 = uStack_e50;
            local_968 = local_e48;
            local_e58 = (pointer)0x0;
            uStack_e50 = (pointer)0x0;
            local_e48 = (pointer)0x0;
            local_e78._M_p = (pointer)(auStack_e70 + 8);
            local_be0._M_dataplus._M_p = (pointer)&local_be0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_be0,"here","");
            make_error_info<>((error_info *)local_df0,&local_ca8,(source_location *)&local_9d8,
                              &local_be0);
            err<toml::error_info>(&local_3a0,(error_info *)local_df0);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_3a0);
            failure<toml::error_info>::~failure(&local_3a0);
            error_info::~error_info((error_info *)local_df0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
              operator_delete(local_be0._M_dataplus._M_p,local_be0.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)&local_9d8);
            uVar21 = local_ca8.field_2._M_allocated_capacity;
            _Var23._M_p = local_ca8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) goto LAB_003c4365;
            goto LAB_003c436d;
          }
          pvVar16 = result<int,_toml::detail::none_t>::unwrap(&local_d38,(source_location)0x5292b0);
          vVar3 = *pvVar16;
          pvVar16 = result<int,_toml::detail::none_t>::unwrap(&local_d40,(source_location)0x5292c8);
          vVar4 = *pvVar16;
          pvVar16 = result<int,_toml::detail::none_t>::unwrap(&local_d48,(source_location)0x5292e0);
          local_e38 = (undefined2)*pvVar16;
          paVar19 = &local_d18.source_name_.field_2;
          local_ea8._M_allocated_capacity = (size_type)&local_e98;
          local_eb8._0_8_ =
               local_d18.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_eb8._8_8_ =
               local_d18.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_d18.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_d18.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d18.source_name_._M_dataplus._M_p == paVar19) {
            local_e98._8_8_ = local_d18.source_name_.field_2._8_8_;
          }
          else {
            local_ea8._M_allocated_capacity = (size_type)local_d18.source_name_._M_dataplus._M_p;
          }
          local_ea8._8_8_ = local_d18.source_name_._M_string_length;
          local_d18.source_name_._M_string_length = 0;
          local_d18.source_name_.field_2._M_local_buf[0] = '\0';
          local_e88 = (pointer)local_d18.length_;
          _Stack_e80._M_p = (pointer)local_d18.first_;
          local_e78._M_p = (pointer)local_d18.first_line_;
          auStack_e70._0_8_ = local_d18.first_column_;
          auStack_e70._8_8_ = local_d18.last_;
          auStack_e70._16_8_ = local_d18.last_line_;
          local_e58 = (pointer)local_d18.last_column_;
          uStack_e50._0_5_ = CONCAT41(local_caf,1);
          uStack_e50 = (pointer)CONCAT44(CONCAT31(uStack_cab,local_caf._3_1_),(undefined4)uStack_e50
                                        );
          local_e48 = local_be8;
          local_e3c = CONCAT22((short)vVar4,(short)vVar3);
          local_e40 = uVar20;
          local_e3f = uVar24;
          local_e3e = uVar22;
          local_d18.source_name_._M_dataplus._M_p = (pointer)paVar19;
          ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                    (&local_548,(toml *)local_eb8,
                     (tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *)
                     (ulong)CONCAT31(uStack_cab,local_caf._3_1_));
          _Var14._M_pi = local_548.value.
                         super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                         .super__Tuple_impl<2UL,_toml::detail::region>.
                         super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          __return_storage_ptr__->is_ok_ = true;
          local_548.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(element_type **)
           &(__return_storage_ptr__->field_1).succ_.value.
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Tuple_impl<2UL,_toml::detail::region>.
            super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_ =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&(__return_storage_ptr__->field_1).succ_.value.
                  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                  .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                  super__Tuple_impl<2UL,_toml::detail::region>.
                  super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 8))->_M_pi =
               _Var14._M_pi;
          local_548.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          pvVar1 = &(__return_storage_ptr__->field_1).fail_.value.locations_;
          (((string *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
          _M_dataplus)._M_p = (pointer)pvVar1;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_548.value.
                               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false> + 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 _M_dataplus._M_p == paVar19) {
            (pvVar1->
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_548.value.
                                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                                   .
                                   super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                                   .super__Tuple_impl<2UL,_toml::detail::region>.
                                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                                   source_name_.field_2._M_allocated_capacity._1_7_,
                                   local_548.value.
                                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                                   .
                                   super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                                   .super__Tuple_impl<2UL,_toml::detail::region>.
                                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                                   source_name_.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->field_1).succ_.value.
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                     super__Tuple_impl<2UL,_toml::detail::region>.
                     super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x28) =
                 local_548.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 field_2._8_8_;
          }
          else {
            (((string *)
             ((long)&(__return_storage_ptr__->field_1).succ_.value.
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                     super__Tuple_impl<2UL,_toml::detail::region>.
                     super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
            _M_dataplus)._M_p =
                 local_548.value.
                 super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
                 _M_dataplus._M_p;
            (__return_storage_ptr__->field_1).fail_.value.locations_.
            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_548.value.
                                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                                   .
                                   super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                                   .super__Tuple_impl<2UL,_toml::detail::region>.
                                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                                   source_name_.field_2._M_allocated_capacity._1_7_,
                                   local_548.value.
                                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                                   .
                                   super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                                   .super__Tuple_impl<2UL,_toml::detail::region>.
                                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                                   source_name_.field_2._M_local_buf[0]);
          }
          *(size_type *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x18) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
               _M_string_length;
          local_548.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
          _M_string_length = 0;
          local_548.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2.
          _M_local_buf[0] = '\0';
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x60) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_column_;
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x50) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_;
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x58) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_line_;
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x40) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_line_;
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x48) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_column_;
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x30) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.length_;
          *(size_t *)
           ((long)&(__return_storage_ptr__->field_1).succ_.value.
                   super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                   .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                   super__Tuple_impl<2UL,_toml::detail::region>.
                   super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x38) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_;
          p_Var12 = &(__return_storage_ptr__->field_1).succ_.value.
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ;
          (p_Var12->super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>).
          super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
          *(undefined7 *)
           &(p_Var12->super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>).
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.field_0x1 =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl._1_7_;
          (__return_storage_ptr__->field_1).succ_.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
          subsecond_precision =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
               super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
               subsecond_precision;
          pvVar11 = &(__return_storage_ptr__->field_1).succ_.value;
          (pvVar11->
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
          (pvVar11->
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
          (pvVar11->
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
          (pvVar11->
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3 =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl._3_1_;
          (pvVar11->
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
          (pvVar11->
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
          *(uint16_t *)((long)&__return_storage_ptr__->field_1 + 0x80) =
               local_548.value.
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               .super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond;
          local_548.value.
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_._M_dataplus.
          _M_p = (pointer)paVar19;
          region::~region((region *)&local_548);
          region::~region((region *)local_eb8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
          operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_a80.field_2._M_allocated_capacity = local_d68.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d68._M_dataplus._M_p == &local_d68.field_2) goto LAB_003c3155;
  }
  operator_delete(local_d68._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
LAB_003c3155:
  region::~region(&local_d18);
  location::~location(&local_a20);
  return __return_storage_ptr__;
}

Assistant:

result<std::tuple<local_time, local_time_format_info, region>, error_info>
parse_local_time_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    local_time_format_info fmt;

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::local_time(spec).scan(loc);
    if( ! reg.is_ok())
    {
        if(spec.v1_1_0_make_seconds_optional)
        {
            return err(make_syntax_error("toml::parse_local_time: "
                "invalid time: time must be HH:MM(:SS.sss) (seconds are optional)",
                syntax::local_time(spec), loc));
        }
        else
        {
            return err(make_syntax_error("toml::parse_local_time: "
                "invalid time: time must be HH:MM:SS(.sss) (subseconds are optional)",
                syntax::local_time(spec), loc));
        }
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();

    // at least we have HH:MM.
    // 01234
    // HH:MM
    const auto hour_r   = from_string<int>(str.substr(0, 2));
    const auto minute_r = from_string<int>(str.substr(3, 2));

    if(hour_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read hour `" + str.substr(0, 2) + "`",
            std::move(src), "here"));
    }
    if(minute_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read minute `" + str.substr(3, 2) + "`",
            std::move(src), "here"));
    }

    const auto hour   = hour_r.unwrap();
    const auto minute = minute_r.unwrap();

    if((hour < 0 || 24 <= hour) || (minute < 0 || 60 <= minute))
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: invalid time.",
            std::move(src), "hour must be 00-23, minute must be 00-59."));
    }

    // -----------------------------------------------------------------------
    // we have hour and minute.
    // Since toml v1.1.0, second and subsecond part becomes optional.
    // Check the version and return if second does not exist.

    if(str.size() == 5 && spec.v1_1_0_make_seconds_optional)
    {
        fmt.has_seconds = false;
        fmt.subsecond_precision = 0;
        return ok(std::make_tuple(local_time(hour, minute, 0), std::move(fmt), std::move(reg)));
    }
    assert(str.at(5) == ':');

    // we have at least `:SS` part. `.subseconds` are optional.

    // 0         1
    // 012345678901234
    // HH:MM:SS.subsec
    const auto sec_r = from_string<int>(str.substr(6, 2));
    if(sec_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read second `" + str.substr(6, 2) + "`",
            std::move(src), "here"));
    }
    const auto sec = sec_r.unwrap();

    if(sec < 0 || 60 < sec) // :60 is allowed
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: invalid time.",
                    std::move(src), "second must be 00-60."));
    }

    if(str.size() == 8)
    {
        fmt.has_seconds = true;
        fmt.subsecond_precision = 0;
        return ok(std::make_tuple(local_time(hour, minute, sec), std::move(fmt), std::move(reg)));
    }

    assert(str.at(8) == '.');

    auto secfrac = str.substr(9, str.size() - 9);

    fmt.has_seconds = true;
    fmt.subsecond_precision = secfrac.size();

    while(secfrac.size() < 9)
    {
        secfrac += '0';
    }
    assert(9 <= secfrac.size());
    const auto ms_r = from_string<int>(secfrac.substr(0, 3));
    const auto us_r = from_string<int>(secfrac.substr(3, 3));
    const auto ns_r = from_string<int>(secfrac.substr(6, 3));

    if(ms_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read milliseconds `" + secfrac.substr(0, 3) + "`",
            std::move(src), "here"));
    }
    if(us_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read microseconds`" + str.substr(3, 3) + "`",
            std::move(src), "here"));
    }
    if(ns_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read nanoseconds`" + str.substr(6, 3) + "`",
            std::move(src), "here"));
    }
    const auto ms = ms_r.unwrap();
    const auto us = us_r.unwrap();
    const auto ns = ns_r.unwrap();

    return ok(std::make_tuple(local_time(hour, minute, sec, ms, us, ns), std::move(fmt), std::move(reg)));
}